

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac_buffer.cc
# Opt level: O0

void __thiscall binpac::FlowBuffer::FlowBuffer(FlowBuffer *this,LineBreakStyle linebreak_style)

{
  LineBreakStyle in_ESI;
  FlowBuffer *in_RDI;
  FlowBuffer *unaff_retaddr;
  
  in_RDI->_vptr_FlowBuffer = (_func_int **)&PTR__FlowBuffer_00106d68;
  in_RDI->buffer_length_ = 0;
  in_RDI->buffer_ = (uchar *)0x0;
  in_RDI->orig_data_begin_ = (const_byteptr)0x0;
  in_RDI->orig_data_end_ = (const_byteptr)0x0;
  in_RDI->linebreak_style_ = in_ESI;
  in_RDI->linebreak_style_default = in_ESI;
  in_RDI->linebreaker_ = '\0';
  ResetLineState(in_RDI);
  in_RDI->mode_ = CR_OR_LF_0;
  in_RDI->frame_length_ = 0;
  in_RDI->chunked_ = false;
  in_RDI->data_seq_at_orig_data_end_ = 0;
  in_RDI->eof_ = false;
  in_RDI->have_pending_request_ = false;
  in_RDI->buffer_n_ = 0;
  NewMessage(unaff_retaddr);
  return;
}

Assistant:

FlowBuffer::FlowBuffer(LineBreakStyle linebreak_style)
	{
	buffer_length_ = 0;
	buffer_ = nullptr;

	orig_data_begin_ = nullptr;
	orig_data_end_ = nullptr;

	linebreak_style_ = linebreak_style;
	linebreak_style_default = linebreak_style;
	linebreaker_ = 0;
	ResetLineState();

	mode_ = UNKNOWN_MODE;
	frame_length_ = 0;
	chunked_ = false;

	data_seq_at_orig_data_end_ = 0;
	eof_ = false;
	have_pending_request_ = false;

	buffer_n_ = 0;

	NewMessage();
	}